

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<unsigned_int> *
wasm::WATParser::elemlist<wasm::WATParser::ParseDeclsCtx>
          (Result<unsigned_int> *__return_storage_ptr__,ParseDeclsCtx *ctx,bool legacy)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> expected;
  allocator<char> local_211;
  string local_210;
  Err local_1f0;
  Err local_1c8;
  Err *local_1a8;
  Err *err_2;
  MaybeResult<wasm::Ok> _val_2;
  MaybeResult<wasm::Ok> func;
  Index res_1;
  Err local_130;
  Err *local_110;
  Err *err_1;
  MaybeResult<wasm::Ok> _val_1;
  MaybeResult<wasm::Ok> elem;
  Index local_b0;
  uint local_ac;
  Index res;
  Err *local_88;
  Err *err;
  MaybeResult<wasm::Ok> _val;
  undefined1 local_48 [8];
  MaybeResult<wasm::Ok> type;
  bool legacy_local;
  ParseDeclsCtx *ctx_local;
  
  type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._39_1_ = legacy;
  maybeReftype<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_48,ctx);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_48);
  if (bVar1) {
    MaybeResult<wasm::Ok>::MaybeResult
              ((MaybeResult<wasm::Ok> *)&err,(MaybeResult<wasm::Ok> *)local_48);
    local_88 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err);
    bVar1 = local_88 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err((Err *)&res,local_88);
      Result<unsigned_int>::Result(__return_storage_ptr__,(Err *)&res);
      wasm::Err::~Err((Err *)&res);
    }
    local_ac = (uint)bVar1;
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err);
    if (local_ac == 0) {
      MaybeResult<wasm::Ok>::operator*((MaybeResult<wasm::Ok> *)local_48);
      local_b0 = ParseDeclsCtx::makeElemList(ctx);
      do {
        maybeElemexpr<wasm::WATParser::ParseDeclsCtx>
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
        bVar1 = wasm::MaybeResult::operator_cast_to_bool
                          ((MaybeResult *)
                           ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        if (bVar1) {
          MaybeResult<wasm::Ok>::MaybeResult
                    ((MaybeResult<wasm::Ok> *)&err_1,
                     (MaybeResult<wasm::Ok> *)
                     ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
          local_110 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_1);
          bVar1 = local_110 != (Err *)0x0;
          if (bVar1) {
            wasm::Err::Err(&local_130,local_110);
            Result<unsigned_int>::Result(__return_storage_ptr__,&local_130);
            wasm::Err::~Err(&local_130);
          }
          local_ac = (uint)bVar1;
          MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_1);
          if (local_ac == 0) {
            MaybeResult<wasm::Ok>::operator*
                      ((MaybeResult<wasm::Ok> *)
                       ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            ParseDeclsCtx::appendElem(ctx,&local_b0);
            local_ac = 0;
          }
        }
        else {
          local_ac = 3;
        }
        MaybeResult<wasm::Ok>::~MaybeResult
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      } while (local_ac == 0);
      if (local_ac == 3) {
        Result<unsigned_int>::Result<unsigned_int>(__return_storage_ptr__,&local_b0);
        local_ac = 1;
      }
    }
  }
  else {
    expected = sv("func",4);
    bVar1 = Lexer::takeKeyword(&ctx->in,expected);
    if ((bVar1) ||
       ((type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._39_1_ & 1) != 0)) {
      func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._36_4_ =
           ParseDeclsCtx::makeFuncElemList(ctx);
      do {
        maybeFuncidx<wasm::WATParser::ParseDeclsCtx>
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
        bVar1 = wasm::MaybeResult::operator_cast_to_bool
                          ((MaybeResult *)
                           ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        if (bVar1) {
          MaybeResult<wasm::Ok>::MaybeResult
                    ((MaybeResult<wasm::Ok> *)&err_2,
                     (MaybeResult<wasm::Ok> *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
          local_1a8 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_2);
          bVar1 = local_1a8 != (Err *)0x0;
          if (bVar1) {
            wasm::Err::Err(&local_1c8,local_1a8);
            Result<unsigned_int>::Result(__return_storage_ptr__,&local_1c8);
            wasm::Err::~Err(&local_1c8);
          }
          local_ac = (uint)bVar1;
          MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_2);
          if (local_ac == 0) {
            MaybeResult<wasm::Ok>::operator*
                      ((MaybeResult<wasm::Ok> *)
                       ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            ParseDeclsCtx::appendFuncElem
                      (ctx,(undefined1 *)
                           ((long)&func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x24));
            local_ac = 0;
          }
        }
        else {
          local_ac = 5;
        }
        MaybeResult<wasm::Ok>::~MaybeResult
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      } while (local_ac == 0);
      if (local_ac == 5) {
        Result<unsigned_int>::Result<unsigned_int>
                  (__return_storage_ptr__,
                   (uint *)((long)&func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x24));
        local_ac = 1;
      }
    }
    else {
      local_ac = 0;
    }
  }
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_48);
  if (local_ac == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"expected element list",&local_211);
    Lexer::err(&local_1f0,&ctx->in,&local_210);
    Result<unsigned_int>::Result(__return_storage_ptr__,&local_1f0);
    wasm::Err::~Err(&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::ElemListT> elemlist(Ctx& ctx, bool legacy) {
  if (auto type = maybeReftype(ctx)) {
    CHECK_ERR(type);
    auto res = ctx.makeElemList(*type);
    while (auto elem = maybeElemexpr(ctx)) {
      CHECK_ERR(elem);
      ctx.appendElem(res, *elem);
    }
    return res;
  } else if (ctx.in.takeKeyword("func"sv) || legacy) {
    auto res = ctx.makeFuncElemList();
    while (auto func = maybeFuncidx(ctx)) {
      CHECK_ERR(func);
      ctx.appendFuncElem(res, *func);
    }
    return res;
  }
  return ctx.in.err("expected element list");
}